

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::
     PrintValue<std::forward_list<int,std::allocator<int>>,void>
               (forward_list<int,_std::allocator<int>_> *container,ostream *os)

{
  _Fwd_list_node_base *p_Var1;
  long lVar2;
  char local_2d [5];
  
  local_2d[2] = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_2d + 2,1);
  p_Var1 = (container->super__Fwd_list_base<int,_std::allocator<int>_>)._M_impl._M_head._M_next;
  if (p_Var1 != (_Fwd_list_node_base *)0x0) {
    lVar2 = 0;
    do {
      if (lVar2 != 0) {
        local_2d[0] = ',';
        std::__ostream_insert<char,std::char_traits<char>>(os,local_2d,1);
        if (lVar2 == 0x20) {
          std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
          goto LAB_001d25f6;
        }
      }
      local_2d[1] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_2d + 1,1);
      std::ostream::operator<<(os,*(int *)&p_Var1[1]._M_next);
      lVar2 = lVar2 + 1;
      p_Var1 = p_Var1->_M_next;
    } while (p_Var1 != (_Fwd_list_node_base *)0x0);
    if (lVar2 != 0) {
LAB_001d25f6:
      local_2d[3] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_2d + 3,1);
    }
  }
  local_2d[4] = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_2d + 4,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }